

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O2

void __thiscall
Eigen::internal::gemm_pack_rhs<double,_long,_4,_1,_false,_false>::operator()
          (gemm_pack_rhs<double,_long,_4,_1,_false,_false> *this,double *blockB,double *rhs,
          long rhsStride,long depth,long cols,long stride,long offset)

{
  long lVar1;
  double *pdVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if (offset != 0 || stride != 0) {
    __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/preritj[P]Extended-Kalman-Filter/src/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                  ,0x4fb,
                  "void Eigen::internal::gemm_pack_rhs<double, long, 4, 1>::operator()(Scalar *, const Scalar *, Index, Index, Index, Index, Index) [Scalar = double, Index = long, nr = 4, StorageOrder = 1, Conjugate = false, PanelMode = false]"
                 );
  }
  lVar1 = cols / 4;
  lVar6 = 0;
  if (depth < 1) {
    depth = lVar6;
  }
  lVar3 = lVar1 * 4;
  pdVar4 = rhs + 3;
  lVar5 = 0;
  for (; pdVar2 = pdVar4, lVar7 = depth, SBORROW8(lVar6,lVar3) != lVar6 + lVar1 * -4 < 0;
      lVar6 = lVar6 + 4) {
    while (lVar7 != 0) {
      blockB[lVar5] = pdVar2[-3];
      blockB[lVar5 + 1] = pdVar2[-2];
      blockB[lVar5 + 2] = pdVar2[-1];
      blockB[lVar5 + 3] = *pdVar2;
      lVar5 = lVar5 + 4;
      pdVar2 = pdVar2 + rhsStride;
      lVar7 = lVar7 + -1;
    }
    pdVar4 = pdVar4 + 4;
  }
  pdVar4 = rhs + lVar1 * 4;
  for (; pdVar2 = pdVar4, lVar1 = depth, lVar3 < cols; lVar3 = lVar3 + 1) {
    while (lVar1 != 0) {
      blockB[lVar5] = *pdVar2;
      lVar5 = lVar5 + 1;
      pdVar2 = pdVar2 + rhsStride;
      lVar1 = lVar1 + -1;
    }
    pdVar4 = pdVar4 + 1;
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_rhs<Scalar, Index, nr, RowMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockB, const Scalar* rhs, Index rhsStride, Index depth, Index cols, Index stride, Index offset)
{
  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK RHS ROWMAJOR");
  EIGEN_UNUSED_VARIABLE(stride)
  EIGEN_UNUSED_VARIABLE(offset)
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index packet_cols = (cols/nr) * nr;
  Index count = 0;
  for(Index j2=0; j2<packet_cols; j2+=nr)
  {
    // skip what we have before
    if(PanelMode) count += nr * offset;
    for(Index k=0; k<depth; k++)
    {
      const Scalar* b0 = &rhs[k*rhsStride + j2];
                blockB[count+0] = cj(b0[0]);
                blockB[count+1] = cj(b0[1]);
      if(nr==4) blockB[count+2] = cj(b0[2]);
      if(nr==4) blockB[count+3] = cj(b0[3]);
      count += nr;
    }
    // skip what we have after
    if(PanelMode) count += nr * (stride-offset-depth);
  }
  // copy the remaining columns one at a time (nr==1)
  for(Index j2=packet_cols; j2<cols; ++j2)
  {
    if(PanelMode) count += offset;
    const Scalar* b0 = &rhs[j2];
    for(Index k=0; k<depth; k++)
    {
      blockB[count] = cj(b0[k*rhsStride]);
      count += 1;
    }
    if(PanelMode) count += stride-offset-depth;
  }
}